

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileWriter.cpp
# Opt level: O0

void __thiscall BufferedFileWriter::BufferedFileWriter(BufferedFileWriter *this)

{
  BufferedFileWriter *this_local;
  
  TerminatableThread::TerminatableThread(&this->super_TerminatableThread);
  (this->super_TerminatableThread)._vptr_TerminatableThread =
       (_func_int **)&PTR__BufferedFileWriter_00440270;
  std::__cxx11::string::string((string *)&this->m_lastErrorStr);
  this->m_terminated = false;
  WaitableSafeQueue<WriterData>::WaitableSafeQueue(&this->m_writeQueue,200);
  this->m_lastErrorCode = 0;
  this->m_nothingToExecute = true;
  TerminatableThread::run(&this->super_TerminatableThread);
  return;
}

Assistant:

BufferedFileWriter::BufferedFileWriter() : m_terminated(false), m_writeQueue(WRITE_QUEUE_MAX_SIZE)
{
    m_lastErrorCode = 0;
    m_nothingToExecute = true;
    run(this);
}